

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
write_to_stream(Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,ostream *os)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  
  for (uVar1 = 0; uVar4 = (ulong)uVar1,
      uVar4 < (ulong)((long)(this->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    pcVar3 = " ";
    if (uVar4 == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(os,pcVar3);
    std::operator<<(poVar2,(string *)
                           ((this->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar4));
  }
  return;
}

Assistant:

void Vec<T>::write_to_stream( std::ostream &os ) const {
    for( unsigned i = 0; i < this->size(); ++i )
        os << ( i ? " " : "" ) << this->operator[]( i );
}